

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigenval.c
# Opt level: O1

double GetMinEigenval(QMatrix *A,PrecondProcType PrecondProc,double OmegaPrecond)

{
  LASErrIdType LVar1;
  void **ppvVar2;
  double *pdVar3;
  char *Object1Name;
  double dVar4;
  
  Q_Lock(A);
  LVar1 = LASResult();
  if (LVar1 != LASOK) {
    return 1.0;
  }
  ppvVar2 = Q_EigenvalInfo(A);
  pdVar3 = (double *)*ppvVar2;
  if (pdVar3 == (double *)0x0) {
    pdVar3 = (double *)malloc(0x20);
    if (pdVar3 == (double *)0x0) {
      Object1Name = Q_GetName(A);
      pdVar3 = (double *)0x0;
      LASError(LASMemAllocErr,"GetMinEigenval",Object1Name,(char *)0x0,(char *)0x0);
    }
    else {
      ppvVar2 = Q_EigenvalInfo(A);
      *ppvVar2 = pdVar3;
      EstimEigenvals(A,PrecondProc,OmegaPrecond);
    }
  }
  if ((PrecondProcType)pdVar3[2] == PrecondProc) {
    if ((pdVar3[3] == OmegaPrecond) && (!NAN(pdVar3[3]) && !NAN(OmegaPrecond))) goto LAB_0010f6bd;
  }
  EstimEigenvals(A,PrecondProc,OmegaPrecond);
LAB_0010f6bd:
  LVar1 = LASResult();
  dVar4 = 1.0;
  if (LVar1 == LASOK) {
    dVar4 = *pdVar3;
  }
  return dVar4;
}

Assistant:

double GetMinEigenval(QMatrix *A, PrecondProcType PrecondProc, double OmegaPrecond)
/* returns estimate for minimum eigenvalue of the matrix A */
{
    double MinEigenval;
    
    EigenvalInfoType *EigenvalInfo;
    
    Q_Lock(A);
    
    if (LASResult() == LASOK) {
        EigenvalInfo = (EigenvalInfoType *)*(Q_EigenvalInfo(A));
        /* if eigenvalues not estimated yet, ... */
        if (EigenvalInfo == NULL) {
            EigenvalInfo = (EigenvalInfoType *)malloc(sizeof(EigenvalInfoType));
            if (EigenvalInfo != NULL) {
	        *(Q_EigenvalInfo(A)) = (void *)EigenvalInfo;
                EstimEigenvals(A, PrecondProc, OmegaPrecond);
            } else {
                LASError(LASMemAllocErr, "GetMinEigenval", Q_GetName(A), NULL, NULL);
            }
        }
	
        /* if eigenvalues estimated with an other preconditioner, ... */
        if (EigenvalInfo->PrecondProcUsed != PrecondProc
	    || EigenvalInfo->OmegaPrecondUsed != OmegaPrecond) {
            EstimEigenvals(A, PrecondProc, OmegaPrecond);
        }

        if (LASResult() == LASOK)
            MinEigenval = EigenvalInfo->MinEigenval;
        else 
            MinEigenval = 1.0;
    } else {
        MinEigenval = 1.0;
    }
    
    return(MinEigenval);             
}